

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t decode_code_length(archive_read *a,rar5 *rar,uint8_t *p,uint16_t code)

{
  uint uVar1;
  wchar_t wVar2;
  wchar_t local_38;
  wchar_t local_34;
  wchar_t add;
  wchar_t length;
  wchar_t lbits;
  uint16_t code_local;
  uint8_t *p_local;
  rar5 *rar_local;
  archive_read *a_local;
  
  if (code < 8) {
    add = L'\0';
    uVar1 = (uint)code;
  }
  else {
    add = code / 4 + L'\xffffffff';
    uVar1 = (code & 3 | 4) << ((byte)add & 0x1f);
  }
  local_34 = uVar1 + L'\x02';
  if (L'\0' < add) {
    length._2_2_ = code;
    _lbits = p;
    p_local = (uint8_t *)rar;
    rar_local = (rar5 *)a;
    wVar2 = read_consume_bits(a,rar,p,add,&local_38);
    if (wVar2 != L'\0') {
      return L'\xffffffff';
    }
    local_34 = local_38 + local_34;
  }
  return local_34;
}

Assistant:

static int decode_code_length(struct archive_read* a, struct rar5* rar,
	const uint8_t* p, uint16_t code)
{
	int lbits, length = 2;

	if(code < 8) {
		lbits = 0;
		length += code;
	} else {
		lbits = code / 4 - 1;
		length += (4 | (code & 3)) << lbits;
	}

	if(lbits > 0) {
		int add;

		if(ARCHIVE_OK != read_consume_bits(a, rar, p, lbits, &add))
			return -1;

		length += add;
	}

	return length;
}